

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.hpp
# Opt level: O2

void __thiscall Container::clear(Container *this)

{
  std::vector<Item,_std::allocator<Item>_>::clear(&this->content);
  this->length = 0;
  return;
}

Assistant:

virtual void clear() {
	  this->content.clear();
	  length = 0;
  }